

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_endure(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  iVar2 = get_skill((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_);
  if (iVar2 != 0) {
    in_stack_ffffffffffffff84 = (int)in_RDI->level;
    in_stack_ffffffffffffff78 = (CHAR_DATA *)(skill_table + gsn_endure);
    this = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&in_stack_ffffffffffffff78->next_in_room + (long)iVar2 * 2) <=
        in_stack_ffffffffffffff84) {
      bVar1 = is_affected(in_RDI,(int)gsn_endure);
      if (bVar1) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
        return;
      }
      if (in_RDI->mana < 0x1e) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
        return;
      }
      iVar2 = number_percent();
      iVar3 = get_skill((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_);
      if (iVar3 < iVar2) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
        check_improve((CHAR_DATA *)af.bitvector[1],af.bitvector[0]._4_4_,af.bitvector[0]._3_1_,
                      af._36_4_);
        in_RDI->mana = in_RDI->mana + -0xf;
        return;
      }
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
      check_improve((CHAR_DATA *)af.bitvector[1],af.bitvector[0]._4_4_,af.bitvector[0]._3_1_,
                    af._36_4_);
      init_affect((AFFECT_DATA *)0x5eb8a2);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
      in_RDI->mana = in_RDI->mana + -0x1e;
      return;
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  return;
}

Assistant:

void do_endure(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;

	if (get_skill(ch, gsn_endure) == 0 || ch->level < skill_table[gsn_endure].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_endure))
	{
		send_to_char("You already have the mental resolve to resist magic.\n\r", ch);
		return;
	}

	if (ch->mana < 30)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	if (number_percent() > get_skill(ch, gsn_endure))
	{
		send_to_char("You try to strengthen your mental resolve but fail.\n\r", ch);
		check_improve(ch, gsn_endure, false, 1);
		ch->mana -= 15;
		return;
	}

	send_to_char("You build up the mental resolve to better resist magic.\n\r", ch);
	check_improve(ch, gsn_endure, true, 1);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_endure;
	af.location = APPLY_SAVING_SPELL;
	af.aftype = AFT_SKILL;
	af.modifier = -20;
	af.level = ch->level;
	af.duration = ch->level;
	affect_to_char(ch, &af);

	ch->mana -= 30;
}